

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O3

StringList * __thiscall
Args::CmdLine::values(StringList *__return_storage_ptr__,CmdLine *this,String *name)

{
  long lVar1;
  int iVar2;
  ArgIface *pAVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ArgIface *__x;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pAVar3 = findArgument(this,name);
  if (pAVar3 == (ArgIface *)0x0) {
LAB_001487d8:
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar2 = (*pAVar3->_vptr_ArgIface[2])(pAVar3);
    if (iVar2 == 2) {
      iVar2 = (*pAVar3->_vptr_ArgIface[0x17])(pAVar3);
      __x = (ArgIface *)CONCAT44(extraout_var_00,iVar2);
    }
    else {
      if (iVar2 == 1) {
        iVar2 = (*pAVar3->_vptr_ArgIface[0x13])(pAVar3);
        lVar1 = *(long *)CONCAT44(extraout_var,iVar2);
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_38,lVar1,((long *)CONCAT44(extraout_var,iVar2))[1] + lVar1);
        __l._M_len = 1;
        __l._M_array = &local_38;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(__return_storage_ptr__,__l,&local_39);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p == &local_38.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      if (iVar2 != 0) goto LAB_001487d8;
      __x = pAVar3 + 0xd;
      if (pAVar3[0xb].m_cmdLine != (CmdLine *)pAVar3[0xc]._vptr_ArgIface) {
        __x = (ArgIface *)&pAVar3[0xb].m_cmdLine;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__x);
  }
  return __return_storage_ptr__;
}

Assistant:

StringList values(
		//! Name of the argument. Should be full name, i.e '-a' or '--arg'
		//! or 'add' if it's a command or subcommand.
		const String & name ) const
	{
		const auto * arg = findArgument( name );

		if( arg )
		{
			switch( arg->type() )
			{
				case ArgType::Command :
					return ( static_cast< const Command* > ( arg )->values() );

				case ArgType::Arg :
					return StringList(
						{ ( static_cast< const Arg* > ( arg )->value() ) } );

				case ArgType::MultiArg :
					return ( static_cast< const MultiArg* > ( arg )->values() );

				default :
					return StringList();
			}
		}
		else
			return StringList();
	}